

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O3

wchar_t rd_monsters_aux(chunk *c)

{
  loc grid;
  loc_conflict grid_00;
  loc_conflict grid_01;
  int16_t iVar1;
  object *poVar2;
  uint uVar3;
  wchar_t wVar4;
  ulong uVar5;
  char *pcVar6;
  int16_t *ip;
  element_info *ip_00;
  uint8_t tmp8u;
  uint16_t tmp16u;
  uint16_t limit;
  monster_conflict monster_body;
  byte local_237;
  ushort local_236;
  undefined4 local_234;
  ushort local_22e;
  uint local_22c;
  monster local_228;
  int local_88;
  char local_84;
  
  wVar4 = L'\0';
  if (player->is_dead == false) {
    rd_u16b(&local_22e);
    uVar5 = (ulong)local_22e;
    if (z_info->level_monster_max < local_22e) {
      pcVar6 = "Too many (%d) monster entries!";
LAB_00163bd9:
      pcVar6 = format(pcVar6,uVar5);
      note(pcVar6);
      wVar4 = L'\xffffffff';
    }
    else {
      wVar4 = L'\0';
      if (1 < local_22e) {
        uVar3 = 1;
        do {
          memset(&local_228,0,0x1a0);
          rd_u16b(&local_236);
          local_228.midx = (wchar_t)local_236;
          rd_string((char *)&local_88,0x50);
          local_228.race = lookup_monster((char *)&local_88);
          if (local_228.race == (monster_race *)0x0) {
            pcVar6 = format("Monster race %s no longer exists!",&local_88);
            note(pcVar6);
            pcVar6 = "Cannot read monster %d";
LAB_00163bd7:
            uVar5 = (ulong)uVar3;
            goto LAB_00163bd9;
          }
          rd_string((char *)&local_88,0x50);
          local_22c = uVar3;
          if (local_84 == '\0' && local_88 == 0x656e6f6e) {
            local_228.original_race = (monster_race *)0x0;
          }
          else {
            local_228.original_race = lookup_monster((char *)&local_88);
          }
          rd_byte(&local_237);
          local_228.grid.y = (int)local_237;
          rd_byte(&local_237);
          local_228.grid.x = (int)local_237;
          rd_s16b(&local_228.hp);
          rd_s16b(&local_228.maxhp);
          rd_byte(&local_228.mspeed);
          rd_byte(&local_228.energy);
          rd_byte(&local_237);
          if (local_237 != 0) {
            ip = local_228.m_timed;
            uVar5 = 0;
            do {
              rd_s16b(ip);
              uVar5 = uVar5 + 1;
              ip = ip + 1;
            } while (uVar5 < local_237);
          }
          if (mflag_size != '\0') {
            uVar5 = 0;
            do {
              rd_byte(local_228.mflag + uVar5);
              uVar5 = uVar5 + 1;
            } while (uVar5 < mflag_size);
          }
          if (of_size != '\0') {
            uVar5 = 0;
            do {
              rd_byte(local_228.known_pstate.flags + uVar5);
              uVar5 = uVar5 + 1;
            } while (uVar5 < of_size);
          }
          if (elem_max != '\0') {
            ip_00 = local_228.known_pstate.el_info;
            uVar5 = 0;
            do {
              rd_s16b(&ip_00->res_level);
              uVar5 = uVar5 + 1;
              ip_00 = ip_00 + 1;
            } while (uVar5 < elem_max);
          }
          rd_u16b(&local_236);
          poVar2 = local_228.mimicked_obj;
          if (local_236 == 0) {
LAB_00163aba:
            local_228.mimicked_obj = poVar2;
            local_234 = 0;
          }
          else {
            grid.y = local_228.grid.y;
            grid.x = local_228.grid.x;
            for (poVar2 = square_object((chunk_conflict *)c,grid); poVar2 != (object *)0x0;
                poVar2 = poVar2->next) {
              if ((int)poVar2->mimicking_m_idx == (uint)local_236) goto LAB_00163aba;
            }
            local_234 = 1;
          }
          poVar2 = rd_item();
          while (poVar2 != (object *)0x0) {
            pile_insert(&local_228.held_obj,poVar2);
            uVar5 = (ulong)poVar2->oidx;
            if (uVar5 == 0) {
              __assert_fail("obj->oidx",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/load.c"
                            ,0x14c,"_Bool rd_monster(struct chunk *, struct monster *)");
            }
            if (c->objects[uVar5] != (object *)0x0) {
              __assert_fail("c->objects[obj->oidx] == NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/load.c"
                            ,0x14d,"_Bool rd_monster(struct chunk *, struct monster *)");
            }
            c->objects[uVar5] = poVar2;
            poVar2 = rd_item();
          }
          rd_u16b(&local_236);
          local_228.group_info[0].index = (wchar_t)local_236;
          rd_byte(&local_237);
          local_228.group_info[0].role = (monster_group_role)local_237;
          rd_u16b(&local_236);
          local_228.group_info[1].index = (wchar_t)local_236;
          rd_byte(&local_237);
          local_228.group_info[1].role = (monster_group_role)local_237;
          if ((char)local_234 != '\0') {
            grid_00.y = local_228.grid.y;
            grid_00.x = local_228.grid.x;
            delete_monster(c,grid_00);
          }
          grid_01.y = local_228.grid.y;
          grid_01.x = local_228.grid.x;
          iVar1 = place_monster(c,grid_01,&local_228,'\0');
          if (local_22c != (int)iVar1) {
            pcVar6 = "Cannot place monster %d";
            uVar3 = local_22c;
            goto LAB_00163bd7;
          }
          uVar3 = local_22c + 1;
        } while (uVar3 < local_22e);
        wVar4 = L'\0';
      }
    }
  }
  return wVar4;
}

Assistant:

static int rd_monsters_aux(struct chunk *c)
{
	int i;
	uint16_t limit;

	/* Only if the player's alive */
	if (player->is_dead)
		return 0;

	/* Read the monster count */
	rd_u16b(&limit);
	if (limit > z_info->level_monster_max) {
		note(format("Too many (%d) monster entries!", limit));
		return (-1);
	}

	/* Read the monsters */
	for (i = 1; i < limit; i++) {
		struct monster *mon;
		struct monster monster_body;

		/* Get local monster */
		mon = &monster_body;
		memset(mon, 0, sizeof(*mon));

		/* Read the monster */
		if (!rd_monster(c, mon)) {
			note(format("Cannot read monster %d", i));
			return (-1);
		}

		/* Place monster in dungeon */
		if (place_monster(c, mon->grid, mon, 0) != i) {
			note(format("Cannot place monster %d", i));
			return (-1);
		}
	}

	return 0;
}